

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t *
convert_to_bitset_or_array_container(run_container_t *rc,int32_t card,uint8_t *resulttype)

{
  ushort uVar1;
  uint16_t uVar2;
  int iVar3;
  rle16_t *prVar4;
  uint16_t *puVar5;
  ulong uVar6;
  array_container_t *paVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ushort uVar12;
  uint8_t uVar13;
  long lVar14;
  uint uVar15;
  
  if (card < 0x1001) {
    paVar7 = array_container_create_given_capacity(card);
    paVar7->cardinality = 0;
    iVar3 = rc->n_runs;
    uVar13 = '\x02';
    if (0 < (long)iVar3) {
      prVar4 = rc->runs;
      puVar5 = paVar7->array;
      lVar10 = 0;
      iVar11 = 0;
      do {
        uVar1 = prVar4[lVar10].value;
        uVar2 = prVar4[lVar10].length;
        uVar12 = uVar2 + uVar1;
        if (uVar1 < uVar12) {
          lVar14 = 0;
          do {
            puVar5[iVar11 + lVar14] = uVar1 + (short)lVar14;
            lVar14 = lVar14 + 1;
          } while (uVar2 != (uint16_t)lVar14);
          iVar11 = iVar11 + (int)lVar14;
        }
        lVar14 = (long)iVar11;
        iVar11 = iVar11 + 1;
        puVar5[lVar14] = uVar12;
        lVar10 = lVar10 + 1;
      } while (lVar10 != iVar3);
      paVar7->cardinality = iVar11;
    }
  }
  else {
    paVar7 = (array_container_t *)bitset_container_create();
    iVar3 = rc->n_runs;
    if (0 < (long)iVar3) {
      prVar4 = rc->runs;
      puVar5 = paVar7->array;
      lVar10 = 0;
      do {
        uVar1 = prVar4[lVar10].value;
        uVar12 = prVar4[lVar10].length;
        uVar15 = (uint)uVar12 + (uint)uVar1;
        uVar8 = (uint)(uVar1 >> 6);
        uVar9 = uVar15 >> 6;
        if (uVar9 - uVar8 == 0) {
          *(ulong *)(puVar5 + (ulong)uVar8 * 4) =
               *(ulong *)(puVar5 + (ulong)uVar8 * 4) |
               (0xffffffffffffffffU >> (0x3fU - (char)uVar12 & 0x3f)) << ((byte)uVar1 & 0x3f);
        }
        else {
          uVar6 = *(ulong *)(puVar5 + (ulong)uVar9 * 4);
          *(ulong *)(puVar5 + (ulong)uVar8 * 4) =
               *(ulong *)(puVar5 + (ulong)uVar8 * 4) | -1L << ((byte)uVar1 & 0x3f);
          if (uVar8 + 1 < uVar9) {
            memset(puVar5 + (ulong)(uVar1 >> 6) * 4 + 4,0xff,
                   (ulong)((uVar9 - uVar8) - 2 >> 1) * 0x10 + 0x10);
          }
          *(ulong *)(puVar5 + (ulong)uVar9 * 4) =
               uVar6 | 0xffffffffffffffffU >> (~(byte)uVar15 & 0x3f);
        }
        lVar10 = lVar10 + 1;
      } while (iVar3 != lVar10);
    }
    paVar7->cardinality = card;
    uVar13 = '\x01';
  }
  *resulttype = uVar13;
  return paVar7;
}

Assistant:

container_t *convert_to_bitset_or_array_container(run_container_t *rc,
                                                  int32_t card,
                                                  uint8_t *resulttype) {
    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
            uint16_t run_start = rc->runs[rlepos].value;
            uint16_t run_end = run_start + rc->runs[rlepos].length;
            for (uint16_t run_value = run_start; run_value < run_end;
                 ++run_value) {
                answer->array[answer->cardinality++] = run_value;
            }
            answer->array[answer->cardinality++] = run_end;
        }
        assert(card == answer->cardinality);
        *resulttype = ARRAY_CONTAINER_TYPE;
        // run_container_free(r);
        return answer;
    }
    bitset_container_t *answer = bitset_container_create();
    for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
        uint16_t run_start = rc->runs[rlepos].value;
        bitset_set_lenrange(answer->words, run_start, rc->runs[rlepos].length);
    }
    answer->cardinality = card;
    *resulttype = BITSET_CONTAINER_TYPE;
    // run_container_free(r);
    return answer;
}